

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbuffer.c
# Opt level: O2

void bounded_buffer_cleanup(bounded_buffer_t *bb)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)bb->size;
  if (bb->size < 1) {
    uVar1 = uVar2;
  }
  iVar3 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    iVar3 = (iVar3 + 1) - (uint)(bb->entries[uVar2] == (entry_t *)0x0);
  }
  if (iVar3 != 0) {
    fprintf(_stderr,
            "\x1b[0;32m[INFO]    %s (%s:%d) \x1b[0mWarning: %d entries in bounded buffer not freed\n\n"
            ,"bounded_buffer_cleanup",
            "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/bounded-buffer/bbuffer.c"
            ,0x3e);
  }
  free(bb->entries);
  pthread_mutex_destroy((pthread_mutex_t *)&bb->lock);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_space);
  pthread_cond_destroy((pthread_cond_t *)&bb->has_items);
  return;
}

Assistant:

void bounded_buffer_cleanup(bounded_buffer_t* bb)
{
    int unfreed_count = 0;
    for (int i=0; i < bb->size; i++)
        if (bb->entries[i] != NULL)
            unfreed_count++;
    if (unfreed_count > 0)
    {
        lwlog_info("Warning: %d entries in bounded buffer not freed\n", unfreed_count);
    }
    free(bb->entries);
    pthread_mutex_destroy(&bb->lock);
    pthread_cond_destroy(&bb->has_space);
    pthread_cond_destroy(&bb->has_items);
}